

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

FilterPropagateResult
duckdb::CheckZonemapTemplated<duckdb::hugeint_t>
          (BaseStatistics *stats,ExpressionType comparison_type,hugeint_t min_value,
          hugeint_t max_value,hugeint_t constant)

{
  InternalException *this;
  long lVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  long lVar4;
  string local_40;
  
  lVar4 = max_value.upper;
  uVar3 = max_value.lower;
  lVar1 = min_value.upper;
  uVar2 = min_value.lower;
  switch((int)CONCAT71(in_register_00000031,comparison_type)) {
  case 0x19:
  case 0x28:
    if ((constant.upper == lVar1 && constant.lower == uVar2) && (lVar1 == lVar4 && uVar2 == uVar3))
    {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.upper < lVar1) {
      return NO_PRUNING_POSSIBLE;
    }
    if (constant.lower < uVar2 && constant.upper == lVar1) {
      return NO_PRUNING_POSSIBLE;
    }
    break;
  case 0x1a:
  case 0x25:
    if (constant.upper < lVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.lower < uVar2 && constant.upper == lVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    if (lVar4 < constant.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (uVar3 < constant.lower && constant.upper == lVar4) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.lower == uVar2 && constant.upper == lVar1) {
      return NO_PRUNING_POSSIBLE;
    }
    return NO_PRUNING_POSSIBLE;
  case 0x1b:
    if (lVar4 < constant.upper) {
      return FILTER_ALWAYS_TRUE;
    }
    if (uVar3 < constant.lower && constant.upper == lVar4) {
      return FILTER_ALWAYS_TRUE;
    }
    break;
  case 0x1c:
    if (constant.upper < lVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant.lower < uVar2 && constant.upper == lVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    return NO_PRUNING_POSSIBLE;
  case 0x1d:
    if ((lVar4 <= constant.upper) && (uVar3 <= constant.lower || constant.upper != lVar4)) {
      return FILTER_ALWAYS_TRUE;
    }
    return NO_PRUNING_POSSIBLE;
  case 0x1e:
    if ((constant.upper <= lVar1) && (constant.lower <= uVar2 || constant.upper != lVar1)) {
      return FILTER_ALWAYS_TRUE;
    }
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Expression type in zonemap check not implemented","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return NO_PRUNING_POSSIBLE;
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type, T min_value,
                                            T max_value, T constant) {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (ConstantExactRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		if (ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (!ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (ConstantExactRange(min_value, max_value, constant)) {
			// corner case of a cluster with one numeric equal to the target constant
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// GreaterThanEquals::Operation(X, C)
		// this can be true only if max(X) >= C
		// if min(X) >= C, then this is always true
		if (GreaterThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// GreaterThan::Operation(X, C)
		// this can be true only if max(X) > C
		// if min(X) > C, then this is always true
		if (GreaterThan::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThan::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LessThanEquals::Operation(X, C)
		// this can be true only if min(X) <= C
		// if max(X) <= C, then this is always true
		if (LessThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
		// LessThan::Operation(X, C)
		// this can be true only if min(X) < C
		// if max(X) < C, then this is always true
		if (LessThan::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThan::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type in zonemap check not implemented");
	}
}